

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3_winograd_int8.h
# Opt level: O2

void ncnn::pack_A_tile_int8(Mat *A,Mat *AT,int batch,int max_ii,int max_kk)

{
  long lVar1;
  int iVar2;
  size_t sVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  undefined2 *puVar15;
  ulong uVar16;
  long lVar17;
  int kk_1;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  long lVar22;
  int kk_2;
  long lVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  undefined2 *puVar27;
  void *pvVar28;
  void *pvVar29;
  undefined2 *puVar30;
  long lVar31;
  long lVar32;
  long local_280;
  long local_278;
  long local_270;
  long local_268;
  long local_260;
  long local_258;
  long local_250;
  long local_238;
  long local_230;
  long local_228;
  long local_220;
  long local_218;
  long local_210;
  long local_208;
  long local_200;
  long local_1f8;
  long local_1f0;
  long local_1e8;
  long local_1e0;
  long local_1d8;
  long local_1d0;
  long local_1c8;
  long local_1c0;
  long local_1b0;
  long local_1a8;
  long local_1a0;
  long local_198;
  long local_190;
  long local_188;
  long local_180;
  long local_178;
  long local_170;
  long local_168;
  long local_160;
  long local_158;
  long local_150;
  long local_148;
  long local_140;
  long local_138;
  long local_130;
  long local_128;
  long local_120;
  long local_118;
  long local_110;
  long local_108;
  long local_f0;
  long local_e8;
  long local_e0;
  long local_d8;
  
  iVar12 = max_kk * batch;
  iVar2 = AT->w;
  sVar3 = AT->elemsize;
  pvVar4 = AT->data;
  lVar23 = (long)iVar12;
  lVar19 = (long)max_ii;
  iVar18 = 0;
  if (0 < max_kk) {
    iVar18 = max_kk;
  }
  local_180 = 0;
  uVar16 = (ulong)(uint)batch;
  if (batch < 1) {
    uVar16 = 0;
  }
  lVar17 = lVar23 * 0x20;
  lVar6 = (ulong)(uint)(batch * 2) * 2;
  local_e8 = (long)(iVar12 * 0xf + batch) * 2;
  local_140 = (long)(iVar12 * 0xf) * 2;
  local_e0 = (long)(iVar12 * 0xe + batch) * 2;
  local_138 = (long)(iVar12 * 0xe) * 2;
  local_d8 = (long)(iVar12 * 0xd + batch) * 2;
  local_130 = (long)(iVar12 * 0xd) * 2;
  local_1a8 = (long)(batch + iVar12 * 0xc) * 2;
  local_128 = (long)(iVar12 * 0xc) * 2;
  local_1a0 = (long)(iVar12 * 0xb + batch) * 2;
  local_238 = (long)(iVar12 * 0xb) * 2;
  local_198 = (long)(iVar12 * 10 + batch) * 2;
  local_230 = (long)(iVar12 * 10) * 2;
  local_190 = (long)(iVar12 * 9 + batch) * 2;
  local_228 = (long)(iVar12 * 9) * 2;
  local_188 = (long)(batch + iVar12 * 8) * 2;
  local_220 = (long)(iVar12 * 8) * 2;
  lVar32 = (long)(iVar12 * 7 + batch) * 2;
  local_270 = (long)(iVar12 * 7) * 2;
  local_218 = (long)(iVar12 * 6 + batch) * 2;
  local_268 = (long)(iVar12 * 6) * 2;
  local_210 = (long)(iVar12 * 5 + batch) * 2;
  local_260 = (long)(iVar12 * 5) * 2;
  local_208 = (long)(batch + iVar12 * 4) * 2;
  local_200 = (long)(iVar12 * 4) * 2;
  local_1f8 = (long)(iVar12 * 3 + batch) * 2;
  local_1f0 = (long)(iVar12 * 3) * 2;
  local_1e8 = (long)(batch + iVar12 * 2) * 2;
  local_1e0 = (long)(iVar12 * 2) * 2;
  local_1d8 = (long)(iVar12 + batch) * 2;
  lVar7 = (ulong)(uint)batch * 2;
  lVar13 = lVar23 * 0x10;
  local_150 = lVar23 * 2;
  lVar1 = lVar23 * 8;
  local_148 = lVar7;
  for (uVar14 = 0; uVar14 != uVar16; uVar14 = uVar14 + 1) {
    puVar30 = (undefined2 *)((long)iVar2 * sVar3 * uVar14 + (long)pvVar4);
    pvVar5 = A->data;
    local_1c0 = local_148;
    local_278 = local_150;
    local_280 = local_1d8;
    local_250 = local_1e0;
    local_1c8 = local_1e8;
    local_258 = local_1f0;
    local_1d0 = local_1f8;
    local_160 = local_200;
    local_108 = local_208;
    local_168 = local_260;
    local_110 = local_210;
    local_170 = local_268;
    local_118 = local_218;
    local_178 = local_270;
    local_f0 = 0;
    lVar25 = local_180;
    pvVar29 = pvVar5;
    local_120 = lVar32;
    for (uVar21 = 0; lVar11 = local_1c0, lVar10 = local_1c8, lVar9 = local_1d0, lVar20 = local_250,
        lVar26 = local_258, lVar22 = local_278, lVar24 = local_280, (long)(uVar21 | 0xf) < lVar19;
        uVar21 = uVar21 + 0x10) {
      lVar24 = local_f0;
      pvVar28 = pvVar29;
      for (iVar12 = 0; iVar12 + 1 < max_kk; iVar12 = iVar12 + 2) {
        *puVar30 = *(undefined2 *)((long)pvVar28 + local_180);
        puVar30[1] = *(undefined2 *)((long)pvVar28 + local_148);
        puVar30[2] = *(undefined2 *)((long)pvVar28 + local_150);
        puVar30[3] = *(undefined2 *)((long)pvVar28 + local_1d8);
        puVar30[4] = *(undefined2 *)((long)pvVar28 + local_1e0);
        puVar30[5] = *(undefined2 *)((long)pvVar28 + local_1e8);
        puVar30[6] = *(undefined2 *)((long)pvVar28 + local_1f0);
        puVar30[7] = *(undefined2 *)((long)pvVar28 + local_1f8);
        puVar30[8] = *(undefined2 *)((long)pvVar28 + local_200);
        puVar30[9] = *(undefined2 *)((long)pvVar28 + local_208);
        puVar30[10] = *(undefined2 *)((long)pvVar28 + local_260);
        puVar30[0xb] = *(undefined2 *)((long)pvVar28 + local_210);
        puVar30[0xc] = *(undefined2 *)((long)pvVar28 + local_268);
        puVar30[0xd] = *(undefined2 *)((long)pvVar28 + local_218);
        puVar30[0xe] = *(undefined2 *)((long)pvVar28 + local_270);
        puVar30[0xf] = *(undefined2 *)((long)pvVar28 + lVar32);
        puVar30[0x10] = *(undefined2 *)((long)pvVar28 + local_220);
        puVar30[0x11] = *(undefined2 *)((long)pvVar28 + local_188);
        puVar30[0x12] = *(undefined2 *)((long)pvVar28 + local_228);
        puVar30[0x13] = *(undefined2 *)((long)pvVar28 + local_190);
        puVar30[0x14] = *(undefined2 *)((long)pvVar28 + local_230);
        puVar30[0x15] = *(undefined2 *)((long)pvVar28 + local_198);
        puVar30[0x16] = *(undefined2 *)((long)pvVar28 + local_238);
        puVar30[0x17] = *(undefined2 *)((long)pvVar28 + local_1a0);
        puVar30[0x18] = *(undefined2 *)((long)pvVar28 + local_128);
        puVar30[0x19] = *(undefined2 *)((long)pvVar28 + local_1a8);
        puVar30[0x1a] = *(undefined2 *)((long)pvVar28 + local_130);
        puVar30[0x1b] = *(undefined2 *)((long)pvVar28 + local_d8);
        puVar30[0x1c] = *(undefined2 *)((long)pvVar28 + local_138);
        puVar30[0x1d] = *(undefined2 *)((long)pvVar28 + local_e0);
        puVar30[0x1e] = *(undefined2 *)((long)pvVar28 + local_140);
        puVar30[0x1f] = *(undefined2 *)((long)pvVar28 + local_e8);
        puVar30 = puVar30 + 0x20;
        pvVar28 = (void *)((long)pvVar28 + lVar6);
        lVar24 = lVar24 + lVar6;
      }
      for (; iVar12 < max_kk; iVar12 = iVar12 + 1) {
        *puVar30 = *(undefined2 *)((long)pvVar5 + lVar24 + local_180);
        puVar30[1] = *(undefined2 *)((long)pvVar5 + lVar24 + local_150);
        puVar30[2] = *(undefined2 *)((long)pvVar5 + lVar24 + local_1e0);
        puVar30[3] = *(undefined2 *)((long)pvVar5 + lVar24 + local_1f0);
        puVar30[4] = *(undefined2 *)((long)pvVar5 + lVar24 + local_200);
        puVar30[5] = *(undefined2 *)((long)pvVar5 + lVar24 + local_260);
        puVar30[6] = *(undefined2 *)((long)pvVar5 + lVar24 + local_268);
        puVar30[7] = *(undefined2 *)((long)pvVar5 + lVar24 + local_270);
        puVar30[8] = *(undefined2 *)((long)pvVar5 + lVar24 + local_220);
        puVar30[9] = *(undefined2 *)((long)pvVar5 + lVar24 + local_228);
        puVar30[10] = *(undefined2 *)((long)pvVar5 + lVar24 + local_230);
        puVar30[0xb] = *(undefined2 *)((long)pvVar5 + lVar24 + local_238);
        puVar30[0xc] = *(undefined2 *)((long)pvVar5 + lVar24 + local_128);
        puVar30[0xd] = *(undefined2 *)((long)pvVar5 + lVar24 + local_130);
        puVar30[0xe] = *(undefined2 *)((long)pvVar5 + lVar24 + local_138);
        puVar30[0xf] = *(undefined2 *)((long)pvVar5 + lVar24 + local_140);
        puVar30 = puVar30 + 0x10;
        lVar24 = lVar24 + lVar7;
      }
      pvVar29 = (void *)((long)pvVar29 + lVar17);
      local_f0 = local_f0 + lVar17;
      lVar25 = lVar25 + lVar17;
      local_120 = local_120 + lVar17;
      local_178 = local_178 + lVar17;
      local_118 = local_118 + lVar17;
      local_170 = local_170 + lVar17;
      local_110 = local_110 + lVar17;
      local_168 = local_168 + lVar17;
      local_108 = local_108 + lVar17;
      local_160 = local_160 + lVar17;
      local_1d0 = local_1d0 + lVar17;
      local_258 = local_258 + lVar17;
      local_1c8 = local_1c8 + lVar17;
      local_250 = local_250 + lVar17;
      local_280 = local_280 + lVar17;
      local_278 = local_278 + lVar17;
      local_1c0 = local_1c0 + lVar17;
    }
    pvVar5 = A->data;
    local_1b0 = 0;
    local_158 = lVar25;
    for (; lVar8 = local_278, lVar31 = local_280, (long)(uVar21 | 7) < lVar19; uVar21 = uVar21 + 8)
    {
      lVar31 = local_1b0;
      for (iVar12 = 0; iVar12 + 1 < max_kk; iVar12 = iVar12 + 2) {
        *puVar30 = *(undefined2 *)((long)pvVar5 + lVar31 + lVar25);
        puVar30[1] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar11);
        puVar30[2] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar22);
        puVar30[3] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar24);
        puVar30[4] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar20);
        puVar30[5] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar10);
        puVar30[6] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar26);
        puVar30[7] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar9);
        puVar30[8] = *(undefined2 *)((long)pvVar5 + lVar31 + local_160);
        puVar30[9] = *(undefined2 *)((long)pvVar5 + lVar31 + local_108);
        puVar30[10] = *(undefined2 *)((long)pvVar5 + lVar31 + local_168);
        puVar30[0xb] = *(undefined2 *)((long)pvVar5 + lVar31 + local_110);
        puVar30[0xc] = *(undefined2 *)((long)pvVar5 + lVar31 + local_170);
        puVar30[0xd] = *(undefined2 *)((long)pvVar5 + lVar31 + local_118);
        puVar30[0xe] = *(undefined2 *)((long)pvVar5 + lVar31 + local_178);
        puVar30[0xf] = *(undefined2 *)((long)pvVar5 + lVar31 + local_120);
        puVar30 = puVar30 + 0x10;
        lVar31 = lVar31 + lVar6;
      }
      for (; iVar12 < max_kk; iVar12 = iVar12 + 1) {
        *puVar30 = *(undefined2 *)((long)pvVar5 + lVar31 + lVar25);
        puVar30[1] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar22);
        puVar30[2] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar20);
        puVar30[3] = *(undefined2 *)((long)pvVar5 + lVar31 + lVar26);
        puVar30[4] = *(undefined2 *)((long)pvVar5 + lVar31 + local_160);
        puVar30[5] = *(undefined2 *)((long)pvVar5 + lVar31 + local_168);
        puVar30[6] = *(undefined2 *)((long)pvVar5 + lVar31 + local_170);
        puVar30[7] = *(undefined2 *)((long)pvVar5 + lVar31 + local_178);
        puVar30 = puVar30 + 8;
        lVar31 = lVar31 + lVar7;
      }
      local_1b0 = local_1b0 + lVar13;
      local_158 = local_158 + lVar13;
      local_1d0 = local_1d0 + lVar13;
      local_258 = local_258 + lVar13;
      local_1c8 = local_1c8 + lVar13;
      local_250 = local_250 + lVar13;
      local_280 = local_280 + lVar13;
      local_278 = local_278 + lVar13;
      local_1c0 = local_1c0 + lVar13;
    }
    pvVar5 = A->data;
    lVar22 = 0;
    lVar25 = local_158;
    lVar24 = local_1c0;
    for (; (long)(uVar21 | 3) < lVar19; uVar21 = uVar21 + 4) {
      lVar26 = lVar22;
      for (iVar12 = 0; iVar12 + 1 < max_kk; iVar12 = iVar12 + 2) {
        *puVar30 = *(undefined2 *)((long)pvVar5 + lVar26 + local_158);
        puVar30[1] = *(undefined2 *)((long)pvVar5 + lVar26 + local_1c0);
        puVar30[2] = *(undefined2 *)((long)pvVar5 + lVar26 + lVar8);
        puVar30[3] = *(undefined2 *)((long)pvVar5 + lVar26 + lVar31);
        puVar30[4] = *(undefined2 *)((long)pvVar5 + lVar26 + local_250);
        puVar30[5] = *(undefined2 *)((long)pvVar5 + lVar26 + local_1c8);
        puVar30[6] = *(undefined2 *)((long)pvVar5 + lVar26 + local_258);
        puVar30[7] = *(undefined2 *)((long)pvVar5 + lVar26 + local_1d0);
        puVar30 = puVar30 + 8;
        lVar26 = lVar26 + lVar6;
      }
      for (; iVar12 < max_kk; iVar12 = iVar12 + 1) {
        *puVar30 = *(undefined2 *)((long)pvVar5 + lVar26 + local_158);
        puVar30[1] = *(undefined2 *)((long)pvVar5 + lVar26 + lVar8);
        puVar30[2] = *(undefined2 *)((long)pvVar5 + lVar26 + local_250);
        puVar30[3] = *(undefined2 *)((long)pvVar5 + lVar26 + local_258);
        puVar30 = puVar30 + 4;
        lVar26 = lVar26 + lVar7;
      }
      lVar22 = lVar22 + lVar1;
      lVar25 = lVar25 + lVar1;
      local_280 = local_280 + lVar1;
      local_278 = local_278 + lVar1;
      lVar24 = lVar24 + lVar1;
    }
    pvVar5 = A->data;
    lVar26 = 0;
    lVar22 = lVar25;
    for (; (long)(uVar21 | 1) < lVar19; uVar21 = uVar21 + 2) {
      lVar20 = lVar26;
      for (iVar12 = 0; iVar12 + 1 < max_kk; iVar12 = iVar12 + 2) {
        *puVar30 = *(undefined2 *)((long)pvVar5 + lVar20 + lVar25);
        puVar30[1] = *(undefined2 *)((long)pvVar5 + lVar20 + lVar24);
        puVar30[2] = *(undefined2 *)((long)pvVar5 + lVar20 + local_278);
        puVar30[3] = *(undefined2 *)((long)pvVar5 + lVar20 + local_280);
        puVar30 = puVar30 + 4;
        lVar20 = lVar20 + lVar6;
      }
      for (; iVar12 < max_kk; iVar12 = iVar12 + 1) {
        *puVar30 = *(undefined2 *)((long)pvVar5 + lVar20 + lVar25);
        puVar30[1] = *(undefined2 *)((long)pvVar5 + lVar20 + local_278);
        puVar30 = puVar30 + 2;
        lVar20 = lVar20 + lVar7;
      }
      lVar26 = lVar26 + lVar23 * 4;
      lVar22 = lVar22 + lVar23 * 4;
    }
    puVar27 = (undefined2 *)(lVar22 + (long)A->data);
    for (; puVar15 = puVar27, iVar12 = iVar18, (long)uVar21 < lVar19; uVar21 = uVar21 + 1) {
      while (iVar12 != 0) {
        *puVar30 = *puVar15;
        puVar30 = puVar30 + 1;
        puVar15 = puVar15 + (uint)batch;
        iVar12 = iVar12 + -1;
      }
      puVar27 = puVar27 + lVar23;
    }
    local_180 = local_180 + 2;
    local_e8 = local_e8 + 2;
    local_140 = local_140 + 2;
    local_e0 = local_e0 + 2;
    local_138 = local_138 + 2;
    local_d8 = local_d8 + 2;
    local_130 = local_130 + 2;
    local_1a8 = local_1a8 + 2;
    local_128 = local_128 + 2;
    local_1a0 = local_1a0 + 2;
    local_238 = local_238 + 2;
    local_198 = local_198 + 2;
    local_230 = local_230 + 2;
    local_190 = local_190 + 2;
    local_228 = local_228 + 2;
    local_188 = local_188 + 2;
    local_220 = local_220 + 2;
    lVar32 = lVar32 + 2;
    local_270 = local_270 + 2;
    local_218 = local_218 + 2;
    local_268 = local_268 + 2;
    local_210 = local_210 + 2;
    local_260 = local_260 + 2;
    local_208 = local_208 + 2;
    local_200 = local_200 + 2;
    local_1f8 = local_1f8 + 2;
    local_1f0 = local_1f0 + 2;
    local_1e8 = local_1e8 + 2;
    local_1e0 = local_1e0 + 2;
    local_1d8 = local_1d8 + 2;
    local_150 = local_150 + 2;
    local_148 = local_148 + 2;
  }
  return;
}

Assistant:

static void pack_A_tile_int8(const Mat& A, Mat& AT, int batch, int max_ii, int max_kk)
{
    const int N = max_kk * batch;

    for (int b = 0; b < batch; b++)
    {
        short* pp = AT.row<short>(b);

        int ii = 0;
#if __SSE2__
#if __AVX2__
#if __AVX512F__
        for (; ii + 15 < max_ii; ii += 16)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                pp[16] = p0[N * 8];
                pp[17] = p0[N * 8 + batch];
                pp[18] = p0[N * 9];
                pp[19] = p0[N * 9 + batch];
                pp[20] = p0[N * 10];
                pp[21] = p0[N * 10 + batch];
                pp[22] = p0[N * 11];
                pp[23] = p0[N * 11 + batch];
                pp[24] = p0[N * 12];
                pp[25] = p0[N * 12 + batch];
                pp[26] = p0[N * 13];
                pp[27] = p0[N * 13 + batch];
                pp[28] = p0[N * 14];
                pp[29] = p0[N * 14 + batch];
                pp[30] = p0[N * 15];
                pp[31] = p0[N * 15 + batch];
                p0 += batch * 2;
                pp += 32;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                pp[8] = p0[N * 8];
                pp[9] = p0[N * 9];
                pp[10] = p0[N * 10];
                pp[11] = p0[N * 11];
                pp[12] = p0[N * 12];
                pp[13] = p0[N * 13];
                pp[14] = p0[N * 14];
                pp[15] = p0[N * 15];
                p0 += batch;
                pp += 16;
            }
        }
#endif // __AVX512F__
        for (; ii + 7 < max_ii; ii += 8)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                pp[8] = p0[N * 4];
                pp[9] = p0[N * 4 + batch];
                pp[10] = p0[N * 5];
                pp[11] = p0[N * 5 + batch];
                pp[12] = p0[N * 6];
                pp[13] = p0[N * 6 + batch];
                pp[14] = p0[N * 7];
                pp[15] = p0[N * 7 + batch];
                p0 += batch * 2;
                pp += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                pp[4] = p0[N * 4];
                pp[5] = p0[N * 5];
                pp[6] = p0[N * 6];
                pp[7] = p0[N * 7];
                p0 += batch;
                pp += 8;
            }
        }
#endif // __AVX2__
        for (; ii + 3 < max_ii; ii += 4)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                pp[4] = p0[N * 2];
                pp[5] = p0[N * 2 + batch];
                pp[6] = p0[N * 3];
                pp[7] = p0[N * 3 + batch];
                p0 += batch * 2;
                pp += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                pp[2] = p0[N * 2];
                pp[3] = p0[N * 3];
                p0 += batch;
                pp += 4;
            }
        }
#endif // __SSE2__
        for (; ii + 1 < max_ii; ii += 2)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk + 1 < max_kk; kk += 2)
            {
                pp[0] = p0[0];
                pp[1] = p0[batch];
                pp[2] = p0[N];
                pp[3] = p0[N + batch];
                p0 += batch * 2;
                pp += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p0[N];
                p0 += batch;
                pp += 2;
            }
        }
        for (; ii < max_ii; ii++)
        {
            const short* p0 = (const short*)A + ii * N + b;

            int kk = 0;
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                p0 += batch;
                pp += 1;
            }
        }
    }
}